

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadalloc.h
# Opt level: O2

void snmalloc::ThreadAlloc::teardown(void)

{
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this;
  undefined8 *in_FS_OFFSET;
  
  this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
         *in_FS_OFFSET;
  if (this != &default_alloc) {
    *(undefined1 *)in_FS_OFFSET = 1;
    Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::flush
              (this,false);
    Pool<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::ConstructAllocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>,_&snmalloc::StandardConfigClientMeta<>::pool>
    ::release((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
              *in_FS_OFFSET);
    *in_FS_OFFSET = &default_alloc;
  }
  return;
}

Assistant:

static void teardown()
    {
      // No work required for teardown.
      if (alloc == &default_alloc)
        return;

      teardown_called = true;
      alloc->flush();
      AllocPool<Config>::release(alloc);
      alloc = const_cast<Alloc*>(&default_alloc);
    }